

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

uint32_t google::protobuf::compiler::cpp::anon_unknown_0::GenChunkMask
                   (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *fields,vector<int,_std::allocator<int>_> *has_bit_indices)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  bool bVar3;
  int v1;
  int v2;
  const_reference ppFVar4;
  char *pcVar5;
  const_reference pvVar6;
  reference ppFVar7;
  LogMessage *pLVar8;
  int __c;
  int __c_00;
  __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  *__rhs;
  undefined1 auVar9 [16];
  LogMessageFatal local_e0 [23];
  Voidify local_c9;
  uint local_c8;
  uint local_c4;
  string *local_c0;
  string *absl_log_internal_check_op_result;
  undefined8 local_b0;
  LogMessageFatal local_a8 [23];
  Voidify local_91;
  string *local_90;
  string *absl_log_internal_check_op_result_1;
  FieldDescriptor *pFStack_80;
  int index;
  FieldDescriptor *field;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  uint32_t chunk_mask;
  int first_index_offset;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *has_bit_indices_local;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  
  local_18 = has_bit_indices;
  has_bit_indices_local = (vector<int,_std::allocator<int>_> *)fields;
  bVar3 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty(fields);
  pvVar2 = local_18;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"!fields.empty()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
               ,0x18d,local_40._M_len,local_40._M_str);
    pLVar8 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar8);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  }
  ppFVar4 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::front((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)has_bit_indices_local);
  pcVar5 = FieldDescriptor::index(*ppFVar4,(char *)has_bit_indices,__c);
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)(int)pcVar5);
  pvVar2 = has_bit_indices_local;
  iVar1 = *pvVar6;
  __range3._4_4_ = 0;
  __end3 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)has_bit_indices_local);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)pvVar2);
  while( true ) {
    __rhs = (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
             *)&field;
    bVar3 = __gnu_cxx::operator!=(&__end3,__rhs);
    if (!bVar3) {
      local_c4 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
      local_c8 = absl::lts_20240722::log_internal::GetReferenceableValue(__range3._4_4_);
      local_c0 = absl::lts_20240722::log_internal::Check_NEImpl<unsigned_int,unsigned_int>
                           (&local_c4,&local_c8,"0u != chunk_mask");
      if (local_c0 == (string *)0x0) {
        return __range3._4_4_;
      }
      auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c0);
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                 ,0x196,auVar9._0_8_,auVar9._8_8_);
      pLVar8 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_e0);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_c9,pLVar8);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_e0);
    }
    ppFVar7 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end3);
    pvVar2 = local_18;
    pFStack_80 = *ppFVar7;
    pcVar5 = FieldDescriptor::index(pFStack_80,(char *)__rhs,__c_00);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)(int)pcVar5);
    absl_log_internal_check_op_result_1._4_4_ = *pvVar6;
    v1 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar1 / 0x20);
    v2 = absl::lts_20240722::log_internal::GetReferenceableValue
                   (absl_log_internal_check_op_result_1._4_4_ / 0x20);
    local_90 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (v1,v2,"first_index_offset == index / 32");
    if (local_90 != (string *)0x0) break;
    __range3._4_4_ =
         1 << ((byte)((long)absl_log_internal_check_op_result_1._4_4_ % 0x20) & 0x1f) |
         __range3._4_4_;
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end3);
  }
  auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_90);
  local_b0 = auVar9._8_8_;
  absl_log_internal_check_op_result = auVar9._0_8_;
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
             ,0x193,absl_log_internal_check_op_result,local_b0);
  pLVar8 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_a8);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_91,pLVar8);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_a8);
}

Assistant:

uint32_t GenChunkMask(const std::vector<const FieldDescriptor*>& fields,
                      const std::vector<int>& has_bit_indices) {
  ABSL_CHECK(!fields.empty());
  int first_index_offset = has_bit_indices[fields.front()->index()] / 32;
  uint32_t chunk_mask = 0;
  for (auto field : fields) {
    // "index" defines where in the _has_bits_ the field appears.
    int index = has_bit_indices[field->index()];
    ABSL_CHECK_EQ(first_index_offset, index / 32);
    chunk_mask |= static_cast<uint32_t>(1) << (index % 32);
  }
  ABSL_CHECK_NE(0u, chunk_mask);
  return chunk_mask;
}